

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openglrenderer.h
# Opt level: O3

void __thiscall
rengine::OpenGLRenderer::drawShadowQuad
          (OpenGLRenderer *this,uint offset,GLuint texId,int radius,vec2 renderSize,vec2 textureSize
          ,vec2 step,vec4 color)

{
  int iVar1;
  Program *pPVar2;
  int iVar3;
  int iVar4;
  float fVar5;
  float local_98;
  float fStack_94;
  float local_88;
  float fStack_84;
  float fStack_78;
  float fStack_74;
  vec2 step_local;
  float fStack_68;
  float fStack_64;
  vec2 textureSize_local;
  float fStack_58;
  float fStack_54;
  vec2 renderSize_local;
  
  pPVar2 = this->m_activeShader;
  if ((anon_struct_32_2_57159ecd_for_prog_shadow *)pPVar2 != &this->prog_shadow) {
    if (pPVar2 == (Program *)0x0) {
      iVar3 = 0;
    }
    else {
      iVar3 = (pPVar2->super_OpenGLShaderProgram).m_attributeCount;
    }
    iVar1 = (this->prog_shadow).super_BlurProgram.super_Program.super_OpenGLShaderProgram.
            m_attributeCount;
    glUseProgram((this->prog_shadow).super_BlurProgram.super_Program.super_OpenGLShaderProgram.m_id)
    ;
    iVar4 = iVar3;
    if (iVar3 < iVar1) {
      do {
        glEnableVertexAttribArray(iVar4);
        iVar4 = iVar4 + 1;
      } while (iVar1 != iVar4);
    }
    while (iVar1 < iVar3) {
      iVar3 = iVar3 + -1;
      glDisableVertexAttribArray(iVar3);
    }
    this->m_activeShader = (Program *)&this->prog_shadow;
  }
  if ((this->m_matrixState & 0x40) != 0) {
    this->m_matrixState = this->m_matrixState & 0xffffffbf;
    glUniformMatrix4fv((this->prog_shadow).super_BlurProgram.super_Program.matrix,1,1,&this->m_proj)
    ;
  }
  glUniform1i((this->prog_shadow).super_BlurProgram.radius,radius);
  fStack_58 = renderSize.x;
  fStack_54 = renderSize.y;
  fStack_68 = textureSize.x;
  fStack_64 = textureSize.y;
  glUniform4f(fStack_58,fStack_54,fStack_68,fStack_64,(this->prog_shadow).super_BlurProgram.dims);
  fVar5 = (float)radius * 0.3 + 0.8;
  fVar5 = fVar5 * fVar5;
  glUniform1f(fVar5 + fVar5,(this->prog_shadow).super_BlurProgram.sigma);
  fStack_78 = step.x;
  fStack_74 = step.y;
  glUniform2f(fStack_78,fStack_74,(this->prog_shadow).super_BlurProgram.step);
  local_88 = color.x;
  fStack_84 = color.y;
  local_98 = color.z;
  fStack_94 = color.w;
  glUniform4f(local_88,fStack_84,local_98,fStack_94,(this->prog_shadow).color);
  glVertexAttribPointer(0,2,0x1406,0,0,(ulong)offset << 3);
  glBindTexture(0xde1,texId);
  glDrawArrays(5,0,4);
  return;
}

Assistant:

inline void OpenGLRenderer::drawShadowQuad(unsigned offset, GLuint texId, int radius, vec2 renderSize, vec2 textureSize, vec2 step, vec4 color)
{
    activateShader(&prog_shadow);
    ensureMatrixUpdated(UpdateShadowProgram, &prog_shadow);

    glUniform1i(prog_shadow.radius, radius);
    glUniform4f(prog_shadow.dims, renderSize.x, renderSize.y, textureSize.x, textureSize.y);
    float sigma = 0.3 * radius + 0.8;
    glUniform1f(prog_shadow.sigma, sigma * sigma * 2.0);
    glUniform2f(prog_shadow.step, step.x, step.y);
    glUniform4f(prog_shadow.color, color.x, color.y, color.z, color.w);

    glVertexAttribPointer(0, 2, GL_FLOAT, GL_FALSE, 0, (void *) (offset * sizeof(vec2)));
    glBindTexture(GL_TEXTURE_2D, texId);
    glDrawArrays(GL_TRIANGLE_STRIP, 0, 4);
}